

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[11],bool,char>(JObject *this,char (*k) [11],bool *v,char *c)

{
  ostream *os;
  char (*local_40) [11];
  Field<char[11],_bool> field;
  
  local_40 = k;
  field.k = (char (*) [11])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (bool *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[11],_bool>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }